

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Chunk.cpp
# Opt level: O1

void __thiscall Chunk::Chunk(Chunk *this,LodRenderer *lodRenderer,repr coords)

{
  int iVar1;
  pointer *__ptr;
  
  memset(this,0,0x1000);
  (this->entities_)._M_t.
  super___uniq_ptr_impl<std::unique_ptr<Entity,_std::default_delete<Entity>_>,_std::default_delete<std::unique_ptr<Entity,_std::default_delete<Entity>_>[]>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::unique_ptr<Entity,_std::default_delete<Entity>_>_*,_std::default_delete<std::unique_ptr<Entity,_std::default_delete<Entity>_>[]>_>
  .super__Head_base<0UL,_std::unique_ptr<Entity,_std::default_delete<Entity>_>_*,_false>.
  _M_head_impl = (unique_ptr<Entity,_std::default_delete<Entity>_> *)0x0;
  this->entitiesCapacity_ = 0;
  this->lodRenderer_ = lodRenderer;
  this->coords_ = coords;
  (this->dirtyFlags_).super__Base_bitset<1UL>._M_w = 0;
  this->empty_ = true;
  this->highlighted_ = false;
  if (Chunk(LodRenderer*,unsigned_long)::staticInit == '\0') {
    iVar1 = __cxa_guard_acquire(&Chunk(LodRenderer*,unsigned_long)::staticInit);
    if (iVar1 != 0) {
      StaticInit::StaticInit(&Chunk::staticInit);
      __cxa_guard_release(&Chunk(LodRenderer*,unsigned_long)::staticInit);
    }
  }
  staticInit_ = &Chunk::staticInit;
  return;
}

Assistant:

Chunk::Chunk(LodRenderer* lodRenderer, ChunkCoords::repr coords) :
    tiles_{},
    entities_(),
    entitiesCapacity_(0),
    lodRenderer_(lodRenderer),
    coords_(coords),
    dirtyFlags_(),
    empty_(true), 
    highlighted_(false) {

    static StaticInit staticInit;
    staticInit_ = &staticInit;
}